

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t sVar3;
  size_t result_2;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  String local_78;
  char *local_58;
  size_t sStack_50;
  size_t local_48;
  size_t sStack_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_58 = (this->text).content.ptr;
  sStack_50 = params->size_;
  local_48 = params_1->size_;
  sStack_40 = params_2->size_;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_58 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  __return_storage_ptr__->size_ = sVar5;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_58 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  local_38 = params_1;
  heapString(&local_78,sVar5);
  pcVar4 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar5 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar4,1,sVar5,sVar5,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_78.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_78.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_78.content.disposer;
  local_48 = 0;
  sStack_40 = 0;
  local_58 = (char *)0x0;
  sStack_50 = 0;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)&local_58 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  local_78.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar5,sVar5,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_78.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_78.content.size_ = sVar5;
  if (pBVar2 != (Branch *)0x0) {
    sVar5 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar5,sVar5,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_78.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_78.content.size_;
  (__return_storage_ptr__->branches).disposer = local_78.content.disposer;
  pcVar4 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (this->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar4,(void *)this->size_,(size_t)__n);
    pcVar4 = pcVar4 + (long)__n;
  }
  sVar3 = params->size_;
  if (sVar3 != 0) {
    memcpy(pcVar4,params->ptr,sVar3);
    pcVar4 = pcVar4 + sVar3;
  }
  sVar3 = local_38->size_;
  if (sVar3 != 0) {
    memcpy(pcVar4,local_38->ptr,sVar3);
    pcVar4 = pcVar4 + sVar3;
  }
  if (params_2->size_ != 0) {
    memcpy(pcVar4,params_2->ptr,params_2->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}